

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_19f4f6::PluralTableSink::put
          (PluralTableSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  char *__s1;
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  undefined7 in_register_00000009;
  int32_t i;
  int i_00;
  long lVar4;
  char *key_local;
  ResourceTable pluralsTable;
  UnicodeString local_70;
  
  key_local = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&pluralsTable,value,status,CONCAT71(in_register_00000009,param_3));
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = 0;
    while (UVar1 = icu_63::ResourceTable::getKeyAndValue(&pluralsTable,i_00,&key_local,value),
          __s1 = key_local, UVar1 != '\0') {
      iVar2 = strcmp(key_local,"dnam");
      lVar4 = 6;
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"per");
        lVar4 = 7;
        if (iVar2 != 0) {
          iVar3 = icu_63::StandardPlural::indexFromString(__s1,status);
          lVar4 = (long)iVar3;
        }
      }
      if (U_ZERO_ERROR < *status) {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->outArray[lVar4].fUnion & (undefined1  [56])0x1)
          != (undefined1  [56])0x0) {
        icu_63::ResourceValue::getUnicodeString(&local_70,value,status);
        icu_63::UnicodeString::moveFrom(this->outArray + lVar4,&local_70);
        icu_63::UnicodeString::~UnicodeString(&local_70);
        if (U_ZERO_ERROR < *status) {
          return;
        }
      }
      i_00 = i_00 + 1;
    }
  }
  return;
}

Assistant:

void put(const char *key, ResourceValue &value, UBool /*noFallback*/, UErrorCode &status) U_OVERRIDE {
        ResourceTable pluralsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; pluralsTable.getKeyAndValue(i, key, value); ++i) {
            int32_t index = getIndex(key, status);
            if (U_FAILURE(status)) { return; }
            if (!outArray[index].isBogus()) {
                continue;
            }
            outArray[index] = value.getUnicodeString(status);
            if (U_FAILURE(status)) { return; }
        }
    }